

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_DuplicateExtensionFieldNumber_Test::
TestBody(ValidationErrorTest_DuplicateExtensionFieldNumber_Test *this)

{
  string_view file_text;
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  ValidationErrorTest::BuildDescriptorMessagesInTestPool(&this->super_ValidationErrorTest);
  file_text._M_str =
       "name: \"foo.proto\" dependency: \"google/protobuf/descriptor.proto\" extension { name: \"option1\" number: 1000 label: LABEL_OPTIONAL             type: TYPE_INT32 extendee: \"google.protobuf.FileOptions\" }"
  ;
  file_text._M_len = 0xc6;
  ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,file_text);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "name: \"bar.proto\" dependency: \"google/protobuf/descriptor.proto\" extension { name: \"option2\" number: 1000 label: LABEL_OPTIONAL             type: TYPE_INT32 extendee: \"google.protobuf.FileOptions\" }"
             ,&local_49);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "bar.proto: option2: NUMBER: Extension number 1000 has already been used in \"google.protobuf.FileOptions\" by extension \"option1\" defined in foo.proto.\n"
             ,&local_4a);
  ValidationErrorTest::BuildFileWithWarnings(&this->super_ValidationErrorTest,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, DuplicateExtensionFieldNumber) {
  BuildDescriptorMessagesInTestPool();

  BuildFile(
      "name: \"foo.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "extension { name: \"option1\" number: 1000 label: LABEL_OPTIONAL "
      "            type: TYPE_INT32 extendee: \"google.protobuf.FileOptions\" }");

  BuildFileWithWarnings(
      "name: \"bar.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "extension { name: \"option2\" number: 1000 label: LABEL_OPTIONAL "
      "            type: TYPE_INT32 extendee: \"google.protobuf.FileOptions\" }",
      "bar.proto: option2: NUMBER: Extension number 1000 has already been used "
      "in \"google.protobuf.FileOptions\" by extension \"option1\" defined in "
      "foo.proto.\n");
}